

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void DB_(PDISASM pMyDisasm)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  char (*__src) [8];
  byte bVar4;
  uint uVar5;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 == 0) {
    return;
  }
  bVar4 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
  __src = RegistersFPU_Masm;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
    __src = RegistersFPU_Nasm;
  }
  if (0xbf < (ulong)bVar4) {
    uVar2 = (ulong)bVar4 - 0xc0 >> 4;
    if (3 < uVar2) goto switchD_00112749_caseD_4;
    uVar5 = (uint)bVar4;
    switch(uVar2) {
    case 0:
      if ((bVar4 & 8) == 0) {
        uVar3 = 0x626e766f6d6366;
      }
      else {
        (pMyDisasm->Operand2).AccessMode = 2;
        uVar3 = 0x656e766f6d6366;
      }
      (pMyDisasm->Instruction).Category = 0x20002;
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
      break;
    case 1:
      if ((bVar4 & 8) == 0) {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fcmovnbe",9);
      }
      else {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fcmovnu",8);
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      (pMyDisasm->Instruction).Category = 0x20002;
      break;
    case 2:
      switch(uVar5 & 0xf) {
      case 0:
        (pMyDisasm->Instruction).Category = 0x20010;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fneni",6);
        break;
      case 1:
        (pMyDisasm->Instruction).Category = 0x20010;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fndisi",7);
        break;
      case 2:
        (pMyDisasm->Instruction).Category = 0x20012;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fnclex",7);
        break;
      case 3:
        (pMyDisasm->Instruction).Category = 0x20012;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fninit",7);
        break;
      case 4:
        (pMyDisasm->Instruction).Category = 0x20010;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fnsetpm",8);
        break;
      case 5:
        (pMyDisasm->Instruction).Category = 0x20002;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"frstpm",7);
        break;
      default:
        if ((uVar5 & 0xf) < 8) goto switchD_00112749_caseD_4;
        (pMyDisasm->Instruction).Category = 0x2000d;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fucomi",7);
        strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
        (pMyDisasm->Operand1).AccessMode = 1;
        goto LAB_00112a48;
      }
      goto LAB_00112b7d;
    case 3:
      uVar5 = uVar5 & 0xf;
      if (7 < uVar5) goto switchD_00112749_caseD_4;
      (pMyDisasm->Instruction).Category = 0x2000d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fcomi",6);
      strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 0x1000;
      (pMyDisasm->Operand1).Registers.fpu = REGS[0];
      (pMyDisasm->Operand1).OpSize = 0x50;
      (pMyDisasm->Operand1).AccessMode = 1;
      goto LAB_00112a53;
    }
    strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = REGS[0];
    (pMyDisasm->Operand1).OpSize = 0x50;
LAB_00112a48:
    uVar5 = uVar5 & 7;
LAB_00112a53:
    strcpy((pMyDisasm->Operand2).OpMnemonic,*__src + (uVar5 << 3));
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 0x1000;
    (pMyDisasm->Operand2).Registers.fpu = *(Int64 *)((long)REGS + (ulong)(uVar5 << 3));
    (pMyDisasm->Operand2).OpSize = 0x50;
    goto LAB_00112b7d;
  }
  bVar4 = bVar4 >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = (uint)bVar4;
  switch(bVar4) {
  case 0:
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fild",5);
    goto LAB_00112998;
  case 1:
    (pMyDisasm->Reserved_).MemDecoration = 3;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fisttp",7);
    break;
  case 2:
    (pMyDisasm->Reserved_).MemDecoration = 3;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fist",4);
    goto LAB_001128de;
  case 3:
    (pMyDisasm->Reserved_).MemDecoration = 3;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fistp",6);
    break;
  default:
switchD_00112749_caseD_4:
    failDecode(pMyDisasm);
    goto LAB_00112b7d;
  case 5:
    (pMyDisasm->Reserved_).MemDecoration = 0x6a;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fld",4);
LAB_00112998:
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 0x1000;
    (pMyDisasm->Operand1).Registers.fpu = 1;
    (pMyDisasm->Operand1).OpSize = 0x50;
    goto LAB_00112b7d;
  case 7:
    (pMyDisasm->Reserved_).MemDecoration = 6;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Instruction).Category = 0x20001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"fstp",4);
LAB_001128de:
    (pMyDisasm->Instruction).Mnemonic[4] = '\0';
  }
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 0x1000;
  (pMyDisasm->Operand2).Registers.fpu = 1;
  (pMyDisasm->Operand2).OpSize = 0x50;
LAB_00112b7d:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ DB_(PDISASM pMyDisasm)
{
    long MyMODRM;
    char (*pRegistersFPU)[8][8] ;

    GV.DECALAGE_EIP = 0;
    if (!Security(2, pMyDisasm)) {return;}
    MyMODRM = *((UInt8*) (GV.EIP_+1));
    pRegistersFPU = &RegistersFPU_Masm;
    if (GV.SYNTAX_ == NasmSyntax) {
        pRegistersFPU = &RegistersFPU_Nasm;
    }
    if (MyMODRM <= 0xbf) {

        GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
        switch (GV.REGOPCODE) {
case 0:
            GV.MemDecoration = Arg2dword;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fild");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 80;
break;
case 1:
            GV.MemDecoration = Arg1dword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fisttp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 2:
            GV.MemDecoration = Arg1dword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fist");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 3:
            GV.MemDecoration = Arg1dword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fistp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 5:
            GV.MemDecoration = Arg2tbyte;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fld");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 80;
break;
case 7:
            GV.MemDecoration = Arg1tbyte;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
default:
            failDecode(pMyDisasm);
        }
    }
    else {
        if ((MyMODRM & 0xf0) == 0xc0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovnb");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovne");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[0];
            pMyDisasm->Operand1.OpSize = 80;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand2.OpSize = 80;
        }
        else if ((MyMODRM & 0xf0) == 0xd0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovnbe");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovnu");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[0];
            pMyDisasm->Operand1.OpSize = 80;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand2.OpSize = 80;
        }
        else if ((MyMODRM & 0xf0) == 0xe0) {

            if ((MyMODRM & 0xf) ==0) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+UNSUPPORTED_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fneni");
                #endif
            }
            else if ((MyMODRM & 0xf) ==1) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+UNSUPPORTED_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fndisi");
                #endif
            }
            else if ((MyMODRM & 0xf) ==2) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fnclex");
                #endif
            }
            else if ((MyMODRM & 0xf) ==3) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fninit");
                #endif
            }
            else if ((MyMODRM & 0xf) ==4) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+UNSUPPORTED_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fnsetpm");
                #endif
            }
            else if ((MyMODRM & 0xf) ==5) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "frstpm");
                #endif
            }
            else if (((MyMODRM & 0xf) >=0x8) && ((MyMODRM & 0xf) <=0xf)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucomi");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[0];
                pMyDisasm->Operand1.OpSize = 80;
                pMyDisasm->Operand1.AccessMode = READ;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand2.OpType = REGISTER_TYPE;
                pMyDisasm->Operand2.Registers.type = FPU_REG;
                pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand2.OpSize = 80;
            }
            else {
                failDecode(pMyDisasm);
            }
        }
        else if ((MyMODRM & 0xf0) == 0xf0) {
            if (((MyMODRM & 0xf) >=0x0) && ((MyMODRM & 0xf) <=0x7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcomi");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[0];
                pMyDisasm->Operand1.OpSize = 80;
                pMyDisasm->Operand1.AccessMode = READ;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand2.OpType = REGISTER_TYPE;
                pMyDisasm->Operand2.Registers.type = FPU_REG;
                pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand2.OpSize = 80;
            }
            else {
                failDecode(pMyDisasm);
            }
        }
        else {
                failDecode(pMyDisasm);
        }
    }
    GV.EIP_ += GV.DECALAGE_EIP+2;
}